

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::setJob(CudaBackend *this,Job *job)

{
  __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
  __last1;
  bool bVar1;
  Config *this_00;
  ulong uVar2;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *pvVar3;
  __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
  in_RDI;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_stack_00000018;
  Miner *in_stack_00000020;
  CudaConfig *in_stack_00000028;
  Job *in_stack_00000038;
  undefined4 in_stack_00000040;
  undefined4 in_stack_00000044;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> threads;
  CudaConfig *cuda;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *in_stack_ffffffffffffff78;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *in_stack_ffffffffffffff88;
  __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
  __first2;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> local_30;
  CudaConfig *local_18;
  
  this_00 = Base::config(*(Base **)(in_RDI._M_current)->device);
  local_18 = Config::cuda(this_00);
  bVar1 = CudaConfig::isEnabled(local_18);
  if (bVar1) {
    CudaBackendPrivate::init
              ((CudaBackendPrivate *)(in_RDI._M_current)->device,(EVP_PKEY_CTX *)local_18);
  }
  uVar2 = (*(code *)((in_RDI._M_current)->miner->super_IApiListener)._vptr_IApiListener)();
  if ((uVar2 & 1) == 0) {
    (*(code *)(in_RDI._M_current)->miner[2].d_ptr)();
  }
  else {
    __first2._M_current = (CudaLaunchData *)local_18;
    Controller::miner(*(Controller **)(in_RDI._M_current)->device);
    CudaConfig::get(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    bVar1 = std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::empty
                      ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
                       __first2._M_current);
    uVar4 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff88 =
           (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
           std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::size
                     ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
                      &(in_RDI._M_current)->device[1].m_topology);
      pvVar3 = (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
               std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::size
                         (&local_30);
      uVar4 = false;
      if (in_stack_ffffffffffffff88 == pvVar3) {
        std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::end
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        __last1._M_current._7_1_ = uVar4;
        __last1._M_current._0_7_ = in_stack_ffffffffffffff98;
        uVar4 = std::
                equal<__gnu_cxx::__normal_iterator<xmrig::CudaLaunchData*,std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>>,__gnu_cxx::__normal_iterator<xmrig::CudaLaunchData*,std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>>>
                          (in_RDI,__last1,__first2);
      }
    }
    if ((bool)uVar4 == false) {
      bVar1 = std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::empty
                        ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
                         __first2._M_current);
      if (bVar1) {
        Log::print(WARNING,
                   "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m"
                   ,tag);
        (*(code *)(in_RDI._M_current)->miner[2].d_ptr)();
      }
      else {
        (*(code *)(in_RDI._M_current)->miner[2].d_ptr)();
        std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::operator=
                  ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
                   __first2._M_current,in_stack_ffffffffffffff88);
        CudaBackendPrivate::start
                  ((CudaBackendPrivate *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   in_stack_00000038);
      }
    }
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::~vector
              ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
               __first2._M_current);
  }
  return;
}

Assistant:

void xmrig::CudaBackend::setJob(const Job &job)
{
    const auto &cuda = d_ptr->controller->config()->cuda();
    if (cuda.isEnabled()) {
        d_ptr->init(cuda);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cuda.get(d_ptr->controller->miner(), d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}